

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O3

int oonf_cfg_init(int argc,char **argv,char *default_cfg_handler)

{
  list_entity **pplVar1;
  oonf_appdata *poVar2;
  size_t sVar3;
  list_entity *plVar4;
  
  _oonf_cfg_instance.default_io = default_cfg_handler;
  cfg_add(&_oonf_cfg_instance);
  poVar2 = oonf_log_get_appdata();
  _global_entries[4].def.value = poVar2->default_lockfile;
  poVar2 = oonf_log_get_appdata();
  sVar3 = strlen(poVar2->default_lockfile);
  _global_entries[4].def.length = sVar3 + 1;
  cfg_schema_add(&_oonf_schema);
  cfg_schema_add_section(&_oonf_schema,&_global_section);
  _oonf_raw_db = cfg_db_add();
  if (_oonf_raw_db == (cfg_db *)0x0) {
    if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x82,(void *)0x0,0,
               "Cannot create raw configuration database.");
    }
  }
  else {
    _oonf_work_db = cfg_db_add();
    if (_oonf_work_db != (cfg_db *)0x0) {
      _oonf_raw_db->schema = &_oonf_schema;
      config_global.lockfile = (char *)0x0;
      config_global.fork = false;
      config_global.failfast = false;
      config_global._42_6_ = 0;
      config_global.plugin_path = (char *)0x0;
      config_global.pidfile = (char *)0x0;
      config_global.plugin = (strarray)ZEXT816(0);
      _first_apply = 1;
      _trigger_reload = 0;
      _trigger_commit = 0;
      plVar4 = oonf_plugin_tree.list_head.next;
      _argc = argc;
      _argv = argv;
      if ((oonf_plugin_tree.list_head.next)->prev == oonf_plugin_tree.list_head.prev) {
        config_global.plugin_path = (char *)0x0;
        config_global.pidfile = (char *)0x0;
        config_global.lockfile = (char *)0x0;
        config_global.fork = false;
        config_global.failfast = false;
        config_global._42_6_ = 0;
        _first_apply = 1;
        _trigger_reload = 0;
        _trigger_commit = 0;
        return 0;
      }
      do {
        oonf_subsystem_configure(&_oonf_schema,(oonf_subsystem *)(plVar4 + -7));
        pplVar1 = &plVar4->next;
        plVar4 = *pplVar1;
      } while ((*pplVar1)->prev != oonf_plugin_tree.list_head.prev);
      return 0;
    }
    if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x89,(void *)0x0,0,
               "Cannot create configuration database.");
    }
    cfg_db_remove(_oonf_raw_db);
  }
  cfg_remove(&_oonf_cfg_instance);
  return -1;
}

Assistant:

int
oonf_cfg_init(int argc, char **argv, const char *default_cfg_handler) {
  struct oonf_subsystem *plugin;

  _oonf_cfg_instance.default_io = default_cfg_handler;
  cfg_add(&_oonf_cfg_instance);

  /* initialize default for lockfile */
  _global_entries[IDX_LOCKFILE].def.value = oonf_log_get_appdata()->default_lockfile;
  _global_entries[IDX_LOCKFILE].def.length = strlen(oonf_log_get_appdata()->default_lockfile) + 1;

  /* initialize schema */
  cfg_schema_add(&_oonf_schema);
  cfg_schema_add_section(&_oonf_schema, &_global_section);

  /* initialize database */
  if ((_oonf_raw_db = cfg_db_add()) == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create raw configuration database.");
    cfg_remove(&_oonf_cfg_instance);
    return -1;
  }

  /* initialize database */
  if ((_oonf_work_db = cfg_db_add()) == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create configuration database.");
    cfg_db_remove(_oonf_raw_db);
    cfg_remove(&_oonf_cfg_instance);
    return -1;
  }

  cfg_db_link_schema(_oonf_raw_db, &_oonf_schema);

  /* initialize global config */
  memset(&config_global, 0, sizeof(config_global));
  _first_apply = true;
  _trigger_reload = false;
  _trigger_commit = false;

  _argc = argc;
  _argv = argv;

  /* initialize already existing plugins */
  avl_for_each_element(&oonf_plugin_tree, plugin, _node) {
    oonf_subsystem_configure(&_oonf_schema, plugin);
  }
  return 0;
}